

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

Options * MemPoolOptionsForTest(Options *__return_storage_ptr__,NodeContext *node)

{
  ArgsManager *argsman;
  CChainParams *chainparams;
  long in_FS_OFFSET;
  Result<void> result;
  _Variant_storage<false,_bilingual_str,_std::monostate> _Stack_68;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->check_ratio = 1;
  __return_storage_ptr__->max_size_bytes = 300000000;
  (__return_storage_ptr__->expiry).__r = 0x127500;
  (__return_storage_ptr__->incremental_relay_feerate).nSatoshisPerK = 1000;
  (__return_storage_ptr__->min_relay_feerate).nSatoshisPerK = 1000;
  (__return_storage_ptr__->dust_relay_feerate).nSatoshisPerK = 3000;
  (__return_storage_ptr__->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value = 0x53;
  (__return_storage_ptr__->max_datacarrier_bytes).super__Optional_base<unsigned_int,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = true;
  __return_storage_ptr__->permit_bare_multisig = true;
  __return_storage_ptr__->require_standard = true;
  __return_storage_ptr__->full_rbf = true;
  __return_storage_ptr__->persist_v1_dat = false;
  (__return_storage_ptr__->limits).ancestor_count = 0x19;
  (__return_storage_ptr__->limits).ancestor_size_vbytes = 0x18a88;
  (__return_storage_ptr__->limits).descendant_count = 0x19;
  (__return_storage_ptr__->limits).descendant_size_vbytes = 0x18a88;
  __return_storage_ptr__->signals =
       (node->validation_signals)._M_t.
       super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
       super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
       super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  argsman = node->args;
  chainparams = Params();
  ApplyArgsManOptions((Result<void> *)&_Stack_68,argsman,chainparams,__return_storage_ptr__);
  inline_assertion_check<true,util::Result<void>const&>
            ((Result<void> *)&_Stack_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/txmempool.cpp"
             ,0x1d,"MemPoolOptionsForTest","result");
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
  ~_Variant_storage(&_Stack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPool::Options MemPoolOptionsForTest(const NodeContext& node)
{
    CTxMemPool::Options mempool_opts{
        // Default to always checking mempool regardless of
        // chainparams.DefaultConsistencyChecks for tests
        .check_ratio = 1,
        .signals = node.validation_signals.get(),
    };
    const auto result{ApplyArgsManOptions(*node.args, ::Params(), mempool_opts)};
    Assert(result);
    return mempool_opts;
}